

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2Impl::composeAndAppend
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool doCompose,UBool onlyContiguous,
          UnicodeString *safeMiddle,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  bool bVar1;
  UChar *pUVar2;
  UChar *text;
  int32_t textLength;
  UnicodeString middle;
  UnicodeString local_70;
  
  if (buffer->start != buffer->limit) {
    pUVar2 = findNextCompBoundary(this,src,limit,onlyContiguous);
    if ((long)pUVar2 - (long)src == 0) {
      bVar1 = true;
    }
    else {
      text = findPreviousCompBoundary(this,buffer->start,buffer->limit,onlyContiguous);
      textLength = (int32_t)((ulong)((long)buffer->limit - (long)text) >> 1);
      icu_63::UnicodeString::UnicodeString(&local_70,text,textLength);
      ReorderingBuffer::removeSuffix(buffer,textLength);
      icu_63::UnicodeString::operator=(safeMiddle,&local_70);
      icu_63::UnicodeString::doAppend
                (&local_70,src,0,(int32_t)((ulong)((long)pUVar2 - (long)src) >> 1));
      if ((local_70.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
        if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_70.fUnion.fFields.fArray = local_70.fUnion.fStackFields.fBuffer;
        }
      }
      else {
        local_70.fUnion.fFields.fArray = (char16_t *)0x0;
      }
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      compose(this,local_70.fUnion.fFields.fArray,
              (char16_t *)
              ((long)local_70.fUnion.fFields.fArray + (long)local_70.fUnion.fFields.fLength * 2),
              onlyContiguous,'\x01',buffer,errorCode);
      bVar1 = *errorCode < U_ILLEGAL_ARGUMENT_ERROR;
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        src = pUVar2;
      }
      icu_63::UnicodeString::~UnicodeString(&local_70);
    }
    if (!bVar1) {
      return;
    }
  }
  if (doCompose == '\0') {
    if (limit == (UChar *)0x0) {
      limit = u_strchr_63(src,L'\0');
    }
    ReorderingBuffer::appendZeroCC(buffer,src,limit,errorCode);
  }
  else {
    compose(this,src,limit,onlyContiguous,'\x01',buffer,errorCode);
  }
  return;
}

Assistant:

void Normalizer2Impl::composeAndAppend(const UChar *src, const UChar *limit,
                                       UBool doCompose,
                                       UBool onlyContiguous,
                                       UnicodeString &safeMiddle,
                                       ReorderingBuffer &buffer,
                                       UErrorCode &errorCode) const {
    if(!buffer.isEmpty()) {
        const UChar *firstStarterInSrc=findNextCompBoundary(src, limit, onlyContiguous);
        if(src!=firstStarterInSrc) {
            const UChar *lastStarterInDest=findPreviousCompBoundary(buffer.getStart(),
                                                                    buffer.getLimit(), onlyContiguous);
            int32_t destSuffixLength=(int32_t)(buffer.getLimit()-lastStarterInDest);
            UnicodeString middle(lastStarterInDest, destSuffixLength);
            buffer.removeSuffix(destSuffixLength);
            safeMiddle=middle;
            middle.append(src, (int32_t)(firstStarterInSrc-src));
            const UChar *middleStart=middle.getBuffer();
            compose(middleStart, middleStart+middle.length(), onlyContiguous,
                    TRUE, buffer, errorCode);
            if(U_FAILURE(errorCode)) {
                return;
            }
            src=firstStarterInSrc;
        }
    }
    if(doCompose) {
        compose(src, limit, onlyContiguous, TRUE, buffer, errorCode);
    } else {
        if(limit==NULL) {  // appendZeroCC() needs limit!=NULL
            limit=u_strchr(src, 0);
        }
        buffer.appendZeroCC(src, limit, errorCode);
    }
}